

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O0

shared_ptr<BER_CONTAINER> __thiscall Counter32Callback::buildTypeWithValue(Counter32Callback *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long in_RSI;
  shared_ptr<BER_CONTAINER> sVar2;
  shared_ptr<Counter32> local_28;
  Counter32Callback *this_local;
  
  this_local = this;
  if (*(long *)(in_RSI + 0x18) == 0) {
    std::shared_ptr<BER_CONTAINER>::shared_ptr((shared_ptr<BER_CONTAINER> *)this,(nullptr_t)0x0);
    _Var1._M_pi = extraout_RDX;
  }
  else {
    std::make_shared<Counter32,unsigned_int&>((uint *)&local_28);
    std::shared_ptr<BER_CONTAINER>::shared_ptr<Counter32,void>
              ((shared_ptr<BER_CONTAINER> *)this,&local_28);
    std::shared_ptr<Counter32>::~shared_ptr(&local_28);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<BER_CONTAINER>)
         sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> Counter32Callback::buildTypeWithValue(){
    ASSERT_VALID_VALUE(this->value);

    return std::make_shared<Counter32>(*this->value);
}